

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void * Wln_NtkToNdr(Wln_Ntk_t *p)

{
  int ModuleId;
  int iVar1;
  int iVar2;
  int iVar3;
  int fSignedness;
  int nInputs;
  int iVar4;
  void *pDesign_00;
  int *pInputs;
  char *local_a0;
  int ModId;
  void *pDesign;
  int iFanin;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Wln_Ntk_t *p_local;
  
  vFanins = (Vec_Int_t *)p;
  pDesign_00 = Ndr_Create(1);
  ModuleId = Ndr_AddModule(pDesign_00,1);
  for (iObj = 0; iVar2 = iObj, iVar1 = Wln_NtkPiNum((Wln_Ntk_t *)vFanins), iVar2 < iVar1;
      iObj = iObj + 1) {
    pDesign._4_4_ = Wln_NtkCi((Wln_Ntk_t *)vFanins,iObj);
    iVar2 = Wln_ObjRangeEnd((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    iVar1 = Wln_ObjRangeBeg((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    iVar3 = Wln_ObjIsSigned((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    Ndr_AddObject(pDesign_00,ModuleId,3,0,iVar2,iVar1,iVar3,0,(int *)0x0,1,
                  (int *)((long)&pDesign + 4),(char *)0x0);
  }
  _k = Vec_IntAlloc(10);
  for (pDesign._4_4_ = 1; iVar2 = pDesign._4_4_, iVar1 = Wln_NtkObjNum((Wln_Ntk_t *)vFanins),
      iVar2 < iVar1; pDesign._4_4_ = pDesign._4_4_ + 1) {
    iVar2 = Wln_ObjIsCio((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    if (iVar2 == 0) {
      Vec_IntClear(_k);
      for (iFanin = 0; iVar2 = iFanin, iVar1 = Wln_ObjFaninNum((Wln_Ntk_t *)vFanins,pDesign._4_4_),
          iVar2 < iVar1; iFanin = iFanin + 1) {
        pDesign._0_4_ = Wln_ObjFanin((Wln_Ntk_t *)vFanins,pDesign._4_4_,iFanin);
        if ((int)pDesign != 0) {
          Vec_IntPush(_k,(int)pDesign);
        }
      }
      iVar2 = Wln_ObjType((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      iVar1 = Wln_ObjRangeEnd((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      iVar3 = Wln_ObjRangeBeg((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      fSignedness = Wln_ObjIsSigned((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      nInputs = Vec_IntSize(_k);
      pInputs = Vec_IntArray(_k);
      iVar4 = Wln_ObjIsConst((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      if (iVar4 == 0) {
        local_a0 = (char *)0x0;
      }
      else {
        local_a0 = Wln_ObjConstString((Wln_Ntk_t *)vFanins,pDesign._4_4_);
      }
      Ndr_AddObject(pDesign_00,ModuleId,iVar2,0,iVar1,iVar3,fSignedness,nInputs,pInputs,1,
                    (int *)((long)&pDesign + 4),local_a0);
    }
  }
  Vec_IntFree(_k);
  for (iObj = 0; iVar2 = iObj, iVar1 = Wln_NtkPoNum((Wln_Ntk_t *)vFanins), iVar2 < iVar1;
      iObj = iObj + 1) {
    pDesign._4_4_ = Wln_NtkCo((Wln_Ntk_t *)vFanins,iObj);
    iVar2 = Wln_ObjRangeEnd((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    iVar1 = Wln_ObjRangeBeg((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    iVar3 = Wln_ObjIsSigned((Wln_Ntk_t *)vFanins,pDesign._4_4_);
    Ndr_AddObject(pDesign_00,ModuleId,4,0,iVar2,iVar1,iVar3,1,(int *)((long)&pDesign + 4),0,
                  (int *)0x0,(char *)0x0);
  }
  return pDesign_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Wln_NtkToNdr( Wln_Ntk_t * p )
{
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Wln_NtkForEachPi( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            0, NULL,  1, &iObj,  NULL  ); // no fanins
    }
    // add internal nodes 
    vFanins = Vec_IntAlloc( 10 );
    Wln_NtkForEachObjInternal( p, iObj ) 
    {
        Vec_IntClear( vFanins );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        Ndr_AddObject( pDesign, ModId, Wln_ObjType(p, iObj), 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iObj,  
            Wln_ObjIsConst(p, iObj) ? Wln_ObjConstString(p, iObj) : NULL ); 
    }
    Vec_IntFree( vFanins );
    // add primary outputs
    Wln_NtkForEachPo( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            1, &iObj,  0, NULL,  NULL ); 
    }
    return pDesign;
}